

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom.cpp
# Opt level: O1

PolarPosition * ear::toPolarPosition(CartesianPosition position)

{
  double dVar1;
  double dVar2;
  PolarPosition *in_RDI;
  double in_stack_00000008;
  double in_stack_00000010;
  double in_stack_00000018;
  
  dVar1 = atan2(in_stack_00000008,in_stack_00000010);
  dVar2 = hypot(in_stack_00000008,in_stack_00000010);
  dVar2 = atan2(in_stack_00000018,dVar2);
  in_RDI->azimuth = dVar1 * -57.29577951308232;
  in_RDI->elevation = dVar2 * 57.29577951308232;
  in_RDI->distance =
       SQRT(in_stack_00000018 * in_stack_00000018 +
            in_stack_00000010 * in_stack_00000010 + in_stack_00000008 * in_stack_00000008);
  return in_RDI;
}

Assistant:

PolarPosition toPolarPosition(CartesianPosition position) {
    auto cart_array = toCartesianVector3d(position);
    return PolarPosition(azimuth(cart_array), elevation(cart_array),
                         distance(cart_array));
  }